

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool __thiscall
ONX_ModelTest::ReadTest
          (ONX_ModelTest *this,FILE *fp,Type test_type,bool bKeepModels,wchar_t *text_log_file_path,
          ON_TextLog *text_log)

{
  bool bVar1;
  undefined1 local_2e8 [8];
  ON_BinaryFile archive;
  undefined1 local_a8 [8];
  ON_TextLogNull devnull;
  ON_TextLog *text_log_local;
  wchar_t *text_log_file_path_local;
  bool bKeepModels_local;
  Type test_type_local;
  FILE *fp_local;
  ONX_ModelTest *this_local;
  
  devnull.super_ON_TextLog._112_8_ = text_log;
  Internal_BeginTest(this);
  ON_TextLogNull::ON_TextLogNull((ON_TextLogNull *)local_a8);
  if (devnull.super_ON_TextLog._112_8_ == 0) {
    devnull.super_ON_TextLog._112_8_ = &ON_TextLog::Null;
  }
  if (fp == (FILE *)0x0) {
    ONX_ErrorCounter::IncrementFailureCount(this->m_error_counts);
    ON_TextLog::Print((ON_TextLog *)devnull.super_ON_TextLog._112_8_,"fp is nullptr.");
  }
  else {
    ON_BinaryFile::ON_BinaryFile((ON_BinaryFile *)local_2e8,read3dm,fp);
    Internal_ReadTest(this,(ON_BinaryArchive *)local_2e8,test_type,bKeepModels,text_log_file_path,
                      (ON_TextLog *)devnull.super_ON_TextLog._112_8_);
    ON_BinaryFile::~ON_BinaryFile((ON_BinaryFile *)local_2e8);
  }
  bVar1 = Internal_TallyTestResults(this);
  ON_TextLogNull::~ON_TextLogNull((ON_TextLogNull *)local_a8);
  return bVar1;
}

Assistant:

bool ONX_ModelTest::ReadTest(
  FILE* fp,
  ONX_ModelTest::Type test_type,
  bool bKeepModels,
  const wchar_t* text_log_file_path,
  ON_TextLog* text_log
)
{
  Internal_BeginTest();

  ON_TextLogNull devnull;
  if (nullptr == text_log)
    text_log = &ON_TextLog::Null;

  for (;;)
  {
    if (nullptr == fp)
    {
      m_error_counts[0].IncrementFailureCount();
      text_log->Print("fp is nullptr.");
      break;
    }

    ON_BinaryFile archive(ON::archive_mode::read3dm, fp);

    Internal_ReadTest(archive, test_type, bKeepModels, text_log_file_path, text_log);
    break;
  }

  return Internal_TallyTestResults();
}